

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O1

void __thiscall apollonia::World::Add(World *this,Body *body)

{
  pointer *pppBVar1;
  iterator __position;
  Body *local_8;
  
  __position._M_current =
       (this->bodies_).super__Vector_base<apollonia::Body_*,_std::allocator<apollonia::Body_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bodies_).super__Vector_base<apollonia::Body_*,_std::allocator<apollonia::Body_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = body;
    std::vector<apollonia::Body*,std::allocator<apollonia::Body*>>::
    _M_realloc_insert<apollonia::Body*const&>
              ((vector<apollonia::Body*,std::allocator<apollonia::Body*>> *)&this->bodies_,
               __position,&local_8);
  }
  else {
    *__position._M_current = body;
    pppBVar1 = &(this->bodies_).
                super__Vector_base<apollonia::Body_*,_std::allocator<apollonia::Body_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void Add(Body* body) { bodies_.push_back(body); }